

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O2

bool __thiscall
QDnsLookupRunnable::sendDnsOverTls
          (QDnsLookupRunnable *this,QDnsLookupReply *reply,
          QSpan<unsigned_char,_18446744073709551615UL> query,ReplyBuffer *response)

{
  byte *pbVar1;
  qsizetype qVar2;
  _Storage<QSslConfiguration,_false> _Var3;
  QAbstractSocket *pQVar4;
  bool bVar5;
  SocketError SVar6;
  Error EVar7;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  undefined1 local_88 [30];
  quint16 size;
  undefined1 *local_68;
  undefined1 *puStack_60;
  _Storage<QSslConfiguration,_false> local_58;
  QAbstractSocket *pQStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QSslSocket::QSslSocket((QSslSocket *)&local_68,(QObject *)0x0);
  QSslConfiguration::defaultConfiguration();
  std::optional<QSslConfiguration>::value_or<QSslConfiguration>
            ((optional<QSslConfiguration> *)&local_58._M_value,
             (QSslConfiguration *)&this->sslConfiguration);
  QSslSocket::setSslConfiguration((QSslSocket *)&local_68,&local_58._M_value);
  QSslConfiguration::~QSslConfiguration(&local_58._M_value);
  QSslConfiguration::~QSslConfiguration((QSslConfiguration *)local_88);
  latin1.m_data = "domain-s";
  latin1.m_size = 8;
  QString::QString((QString *)&local_58._M_value,latin1);
  QAbstractSocket::setProtocolTag((QAbstractSocket *)&local_68,(QString *)&local_58._M_value);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58._M_value)
  ;
  pbVar1 = query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data + 3;
  *pbVar1 = *pbVar1 | 0x20;
  size = (ushort)query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size << 8 |
         (ushort)query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size >> 8;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000l>>
            ((QDeadlineTimer *)local_88,(duration<long,_std::ratio<1L,_1000L>_>)0x1d4c0,CoarseTimer)
  ;
  QHostAddress::toString((QString *)&local_58._M_value,&this->nameserver);
  QSslSocket::connectToHostEncrypted
            ((QSslSocket *)&local_68,(QString *)&local_58._M_value,this->port,(OpenMode)0x3,
             AnyIPProtocol);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58._M_value)
  ;
  QIODevice::write((char *)&local_68,(longlong)&size);
  QIODevice::write((char *)&local_68,
                   (longlong)query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data);
  bVar5 = QSslSocket::waitForEncrypted((QSslSocket *)&local_68,15000);
  if (bVar5) {
    QSslSocket::sslConfiguration((QSslSocket *)&local_58._M_value);
    std::optional<QSslConfiguration>::operator=(&reply->sslConfiguration,&local_58._M_value);
    QSslConfiguration::~QSslConfiguration(&local_58._M_value);
    local_58.field2 = local_88;
    pQStack_50 = (QAbstractSocket *)&local_68;
    bVar5 = sendDnsOverTls::anon_class_16_2_16dbff69::operator()
                      ((anon_class_16_2_16dbff69 *)&local_58._M_value,&size,2);
    if (bVar5) {
      size = size << 8 | size >> 8;
      QVarLengthArray<unsigned_char,_1232LL>::resize(response,(ulong)size);
      bVar5 = sendDnsOverTls::anon_class_16_2_16dbff69::operator()
                        ((anon_class_16_2_16dbff69 *)&local_58._M_value,
                         (response->super_QVLABase<unsigned_char>).super_QVLABaseBase.ptr,(uint)size
                        );
      if (bVar5) {
        if (3 < size) {
          reply->authenticData =
               (bool)(*(byte *)((long)(response->super_QVLABase<unsigned_char>).super_QVLABaseBase.
                                      ptr + 3) >> 5 & 1);
        }
        bVar5 = true;
        goto LAB_0020ed30;
      }
    }
  }
  SVar6 = QAbstractSocket::error((QAbstractSocket *)&local_68);
  EVar7 = ResolverError;
  if (SVar6 == ProxyConnectionTimeoutError) {
    EVar7 = TimeoutError;
  }
  if (SVar6 == SocketTimeoutError) {
    EVar7 = TimeoutError;
  }
  QIODevice::errorString();
  reply->error = EVar7;
  _Var3 = (_Storage<QSslConfiguration,_false>)(reply->errorString).d.d;
  pQVar4 = (QAbstractSocket *)(reply->errorString).d.ptr;
  (reply->errorString).d.d = (Data *)local_58;
  (reply->errorString).d.ptr = (char16_t *)pQStack_50;
  qVar2 = (reply->errorString).d.size;
  (reply->errorString).d.size = local_48;
  local_58 = _Var3;
  pQStack_50 = pQVar4;
  local_48 = qVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58._M_value)
  ;
  bVar5 = false;
LAB_0020ed30:
  QSslSocket::~QSslSocket((QSslSocket *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QDnsLookupRunnable::sendDnsOverTls(QDnsLookupReply *reply, QSpan<unsigned char> query,
                                        ReplyBuffer &response)
{
    QSslSocket socket;
    socket.setSslConfiguration(sslConfiguration.value_or(QSslConfiguration::defaultConfiguration()));

#  if QT_CONFIG(networkproxy)
    socket.setProtocolTag("domain-s"_L1);
#  endif

    // Request the name server attempt to authenticate the reply.
    query[3] |= DnsAuthenticDataBit;

    do {
        quint16 size = qToBigEndian<quint16>(query.size());
        QDeadlineTimer timeout(DnsOverTlsTimeout);

        socket.connectToHostEncrypted(nameserver.toString(), port);
        socket.write(reinterpret_cast<const char *>(&size), sizeof(size));
        socket.write(reinterpret_cast<const char *>(query.data()), query.size());
        if (!socket.waitForEncrypted(DnsOverTlsConnectTimeout.count()))
            break;

        reply->sslConfiguration = socket.sslConfiguration();

        // accumulate reply
        auto waitForBytes = [&](void *buffer, int count) {
            int remaining = timeout.remainingTime();
            while (remaining >= 0 && socket.bytesAvailable() < count) {
                if (!socket.waitForReadyRead(remaining))
                    return false;
            }
            return socket.read(static_cast<char *>(buffer), count) == count;
        };
        if (!waitForBytes(&size, sizeof(size)))
            break;

        // note: strictly speaking, we're allocating memory based on untrusted data
        // but in practice, due to limited range of the data type (16 bits),
        // the maximum allocation is small.
        size = qFromBigEndian(size);
        response.resize(size);
        if (waitForBytes(response.data(), size)) {
            // check if the AD bit is set; we'll trust it over TLS requests
            if (size >= 4)
                reply->authenticData = response[3] & DnsAuthenticDataBit;
            return true;
        }
    } while (false);

    // handle errors
    return makeReplyErrorFromSocket(reply, &socket);
}